

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O0

void __thiscall CDirectiveData::writeSymData(CDirectiveData *this,SymbolData *symData)

{
  size_t sVar1;
  SymbolData *symData_local;
  CDirectiveData *this_local;
  
  if ((this->ascii & 1U) == 1) {
    SymbolData::addData(symData,this->RamPos,this->SpaceNeeded,DataAscii);
  }
  else {
    sVar1 = this->UnitSize;
    if (sVar1 == 1) {
      SymbolData::addData(symData,this->RamPos,this->SpaceNeeded,Data8);
    }
    else if (sVar1 == 2) {
      SymbolData::addData(symData,this->RamPos,this->SpaceNeeded,Data16);
    }
    else if (sVar1 == 4) {
      SymbolData::addData(symData,this->RamPos,this->SpaceNeeded,Data32);
    }
  }
  return;
}

Assistant:

void CDirectiveData::writeSymData(SymbolData& symData)
{
	if (ascii == true)
	{
		symData.addData(RamPos,SpaceNeeded,SymbolData::DataAscii);
	} else {
		switch (UnitSize)
		{
		case 1:
			symData.addData(RamPos,SpaceNeeded,SymbolData::Data8);
			break;
		case 2:
			symData.addData(RamPos,SpaceNeeded,SymbolData::Data16);
			break;
		case 4:
			symData.addData(RamPos,SpaceNeeded,SymbolData::Data32);
			break;
		}
	}
}